

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrConstIndex<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  JavascriptArrayBuffer *pJVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 *puVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar10;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ulong uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  
  switch(playout->ViewType) {
  case TYPE_INT8:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(char *)(CONCAT44(extraout_var_07,iVar6) + (ulong)uVar2);
    }
    goto LAB_00a77fa4;
  case TYPE_UINT8:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(byte *)(CONCAT44(extraout_var_08,iVar6) + (ulong)uVar2);
    }
    goto LAB_00a77fa4;
  case TYPE_INT16:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(short *)(CONCAT44(extraout_var_04,iVar6) + (ulong)uVar2);
    }
    goto LAB_00a77fa4;
  case TYPE_UINT16:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = (uint)*(ushort *)(CONCAT44(extraout_var_06,iVar6) + (ulong)uVar2);
    }
    goto LAB_00a77fa4;
  case TYPE_INT32:
  case TYPE_UINT32:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    uVar7 = 0;
    if (uVar2 < uVar5) {
      uVar7 = *(uint *)(CONCAT44(extraout_var,iVar6) + (ulong)uVar2);
    }
LAB_00a77fa4:
    *(uint *)(*(long *)(this + 0x118) + uVar11 * 4) = uVar7;
    return;
  case TYPE_FLOAT32:
    uVar2 = playout->SlotIndex;
    bVar1 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar12 = *(undefined4 *)(CONCAT44(extraout_var_10,iVar6) + (ulong)uVar2);
    }
    else {
      uVar12 = 0x7fc00000;
    }
    *(undefined4 *)(*(long *)(this + 0x130) + (ulong)bVar1 * 4) = uVar12;
    return;
  case TYPE_FLOAT64:
    uVar2 = playout->SlotIndex;
    bVar1 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar13 = *(undefined8 *)(CONCAT44(extraout_var_05,iVar6) + (ulong)uVar2);
    }
    else {
      uVar13 = 0x7ff8000000000000;
    }
    *(undefined8 *)(*(long *)(this + 0x128) + (ulong)bVar1 * 8) = uVar13;
    return;
  case TYPE_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = *(ulong *)(CONCAT44(extraout_var_12,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_INT8_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(char *)(CONCAT44(extraout_var_03,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_UINT8_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(byte *)(CONCAT44(extraout_var_11,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_INT16_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(short *)(CONCAT44(extraout_var_01,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_UINT16_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_INT32_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(int *)(CONCAT44(extraout_var_09,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  case TYPE_UINT32_TO_INT64:
    uVar2 = playout->SlotIndex;
    uVar11 = (ulong)playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    uVar7 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar2 < uVar7) {
      uVar10 = (ulong)*(uint *)(CONCAT44(extraout_var_00,iVar6) + (ulong)uVar2);
      goto LAB_00a780ab;
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2395,"((0))","UNREACHED");
    if (bVar4) {
      *puVar9 = 0;
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  uVar10 = 0;
LAB_00a780ab:
  *(ulong *)(*(long *)(this + 0x120) + uVar11 * 8) = uVar10;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrConstIndex(const unaligned T* playout)
    {
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(playout->SlotIndex, playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }